

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O1

bool Reflection::get<double>(Struct *target,string *name,double *value,size_t offset)

{
  char cVar1;
  char *pcVar2;
  char *__s2;
  char *__s2_00;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  undefined4 extraout_var_01;
  double *pdVar5;
  bool bVar6;
  type_info *type;
  
  iVar3 = (*target->_vptr_Struct[1])();
  __s2 = _glCreateShader;
  type = (type_info *)CONCAT44(extraout_var,iVar3);
  if (type == (type_info *)0x0) {
    return false;
  }
  pcVar2 = *(char **)(type + 8);
  bVar6 = pcVar2 == _glCreateShader;
  if ((bVar6) || ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,_glCreateShader), iVar3 == 0)))) {
    iVar3 = (*target->_vptr_Struct[5])(target,name);
    pdVar5 = (double *)(CONCAT44(extraout_var_00,iVar3) + offset * 8);
  }
  else {
    __s2_00 = __M_erase;
    if (pcVar2 == __M_erase) {
      bVar6 = true;
    }
    else {
      cVar1 = *pcVar2;
      if (cVar1 != '*') {
        iVar3 = strcmp(pcVar2,__M_erase);
        bVar6 = iVar3 == 0 || pcVar2 == __s2;
        if (cVar1 != '*' && (iVar3 != 0 && pcVar2 != __s2)) {
          iVar3 = strcmp(pcVar2,__s2);
          bVar6 = iVar3 == 0;
        }
      }
    }
    sVar4 = TypeInfo::size(type);
    bVar6 = (bool)(sVar4 < 8 & bVar6);
    if (bVar6 != true) {
      return bVar6;
    }
    iVar3 = (*target->_vptr_Struct[5])(target,name);
    pdVar5 = (double *)(sVar4 * offset + CONCAT44(extraout_var_01,iVar3));
    pcVar2 = *(char **)(type + 8);
    if ((pcVar2 == __s2_00) || ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,__s2_00), iVar3 == 0)))) {
      *value = (double)*(float *)pdVar5;
    }
    if (pcVar2 != __s2) {
      if (*pcVar2 == '*') {
        return true;
      }
      iVar3 = strcmp(pcVar2,__s2);
      if (iVar3 != 0) {
        return true;
      }
    }
  }
  *value = *pdVar5;
  return true;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}